

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_encode_extl(char *data,int8_t type,uint32_t len)

{
  long lVar1;
  
  if (len - 1 < 0x10) {
    if (mp_ext_hint[len - 1] != '\0') {
      *data = mp_ext_hint[len - 1];
      lVar1 = 1;
      goto LAB_001149d4;
    }
  }
  else if (0xff < len) {
    if (len < 0x10000) {
      *data = -0x38;
      *(ushort *)(data + 1) = (ushort)len << 8 | (ushort)len >> 8;
      lVar1 = 3;
    }
    else {
      *data = -0x37;
      *(uint32_t *)(data + 1) =
           len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
      lVar1 = 5;
    }
    goto LAB_001149d4;
  }
  *data = -0x39;
  data[1] = (char)len;
  lVar1 = 2;
LAB_001149d4:
  data[lVar1] = type;
  return data + lVar1 + 1;
}

Assistant:

MP_IMPL char *
mp_encode_extl(char *data, int8_t type, uint32_t len)
{
	/*
	 * Only use fixext when length is exactly 1, 2, 4, 8 or 16.
	 * Otherwise use ext 8 if length <= 255.
	 */
	if (len && len <= 16 && mp_ext_hint[len-1]) {
		data = mp_store_u8(data, mp_ext_hint[len-1]);
	} else if (len <= UINT8_MAX) {
		data = mp_store_u8(data, 0xc7);
		data = mp_store_u8(data, (uint8_t) len);
	} else if (len <= UINT16_MAX) {
		data = mp_store_u8(data, 0xc8);
		data = mp_store_u16(data, (uint16_t) len);
	} else {
		data = mp_store_u8(data, 0xc9);
		data = mp_store_u32(data,len);
	}
	data = mp_store_u8(data, type);
	return data;
}